

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

bool __thiscall QHostAddress::operator==(QHostAddress *this,SpecialAddress other)

{
  QHostAddressPrivate *pQVar1;
  quint32 qVar2;
  
  switch(other) {
  case Null:
    return ((this->d).d.ptr)->protocol == -1;
  case Broadcast:
    qVar2 = 0xffffffff;
    break;
  case LocalHost:
    qVar2 = 0x7f000001;
    break;
  case LocalHostIPv6:
  case AnyIPv6:
    pQVar1 = (this->d).d.ptr;
    if (pQVar1->protocol != '\x01') {
      return false;
    }
    if ((pQVar1->field_1).a6_64.c[0] != 0) {
      return false;
    }
    return (pQVar1->field_1).a6_64.c[1] == (ulong)(other == LocalHostIPv6) << 0x38;
  case Any:
    return ((this->d).d.ptr)->protocol == '\x02';
  default:
    qVar2 = 0;
  }
  pQVar1 = (this->d).d.ptr;
  if (pQVar1->protocol == '\0') {
    return pQVar1->a == qVar2;
  }
  return false;
}

Assistant:

bool QHostAddress::operator ==(SpecialAddress other) const
{
    quint32 ip4 = INADDR_ANY;
    switch (other) {
    case Null:
        return d->protocol == QHostAddress::UnknownNetworkLayerProtocol;

    case Broadcast:
        ip4 = INADDR_BROADCAST;
        break;

    case LocalHost:
        ip4 = INADDR_LOOPBACK;
        break;

    case Any:
        return d->protocol == QHostAddress::AnyIPProtocol;

    case AnyIPv4:
        break;

    case LocalHostIPv6:
    case AnyIPv6:
        if (d->protocol == QHostAddress::IPv6Protocol) {
            quint64 second = quint8(other == LocalHostIPv6);  // 1 for localhost, 0 for any
            return d->a6_64.c[0] == 0 && d->a6_64.c[1] == qToBigEndian(second);
        }
        return false;
    }

    // common IPv4 part
    return d->protocol == QHostAddress::IPv4Protocol && d->a == ip4;
}